

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsgf.c
# Opt level: O0

jsgf_rule_t * jsgf_import_rule(jsgf_t *jsgf,char *name)

{
  jsgf_rule_t *rule_00;
  hash_table_t *h;
  int iVar1;
  int32 iVar2;
  size_t sVar3;
  char *pcVar4;
  jsgf_rule_t *pjVar5;
  bool bVar6;
  char *newname;
  void *val_1;
  char *rule_name;
  int rule_matches;
  jsgf_rule_t *rule;
  hash_entry_t *he;
  hash_iter_t *itor;
  jsgf_t *pjStack_58;
  int import_all;
  jsgf_t *imp;
  void *val;
  size_t packlen;
  size_t namelen;
  char *newpath;
  char *path;
  char *c;
  char *name_local;
  jsgf_t *jsgf_local;
  
  c = name;
  name_local = (char *)jsgf;
  packlen = strlen(name);
  newpath = (char *)__ckd_malloc__(packlen + 4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                                   ,0x2c6);
  strcpy(newpath,c + 1);
  path = strrchr(newpath,0x2e);
  if (path == (char *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
            ,0x2cb,"Imported rule is not qualified: %s\n",c);
    ckd_free(newpath);
  }
  else {
    val = path + -(long)newpath;
    *path = '\0';
    sVar3 = strlen(c);
    bVar6 = false;
    if (2 < sVar3) {
      iVar1 = strcmp(c + (packlen - 3),".*>");
      bVar6 = iVar1 == 0;
    }
    for (path = newpath; *path != '\0'; path = path + 1) {
      if (*path == '.') {
        *path = '/';
      }
    }
    strcat(newpath,".gram");
    namelen = (size_t)path_list_search(*(glist_t *)(name_local + 0x38),newpath);
    if ((char *)namelen == (char *)0x0) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
              ,0x2dd,"Failed to find grammar %s\n",newpath);
      ckd_free(newpath);
    }
    else {
      ckd_free(newpath);
      newpath = (char *)namelen;
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
              ,0x2e4,"Importing %s from %s to %s\n",c,namelen,*(undefined8 *)(name_local + 0x18));
      iVar2 = hash_table_lookup(*(hash_table_t **)(name_local + 0x28),newpath,&imp);
      if (iVar2 == 0) {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                ,0x2ea,"Already imported %s\n",newpath);
        pjStack_58 = imp;
        ckd_free(newpath);
      }
      else {
        pjStack_58 = jsgf_parse_file(newpath,(jsgf_t *)name_local);
        imp = (jsgf_t *)hash_table_enter(*(hash_table_t **)(name_local + 0x28),newpath,pjStack_58);
        if (imp != pjStack_58) {
          err_msg(ERR_WARN,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                  ,0x2f3,"Multiply imported file: %s\n",newpath);
        }
      }
      if (pjStack_58 != (jsgf_t *)0x0) {
        for (he = (hash_entry_t *)hash_table_iter(pjStack_58->rules); he != (hash_entry_t *)0x0;
            he = (hash_entry_t *)hash_table_iter_next((hash_iter_t *)he)) {
          rule_00 = *(jsgf_rule_t **)(he->len + 0x10);
          pcVar4 = importname2rulename(c);
          if (bVar6) {
            iVar1 = strncmp(pcVar4,rule_00->name,(long)val + 1);
          }
          else {
            iVar1 = strcmp(pcVar4,rule_00->name);
          }
          ckd_free(pcVar4);
          if ((rule_00->is_public != 0) && (iVar1 == 0)) {
            path = strrchr(rule_00->name,0x2e);
            if (path == (char *)0x0) {
              __assert_fail("c != NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                            ,0x310,"jsgf_rule_t *jsgf_import_rule(jsgf_t *, char *)");
            }
            pcVar4 = jsgf_fullname((jsgf_t *)name_local,path);
            err_msg(ERR_INFO,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                    ,0x313,"Imported %s\n",pcVar4);
            h = *(hash_table_t **)(name_local + 0x20);
            pjVar5 = jsgf_rule_retain(rule_00);
            pjVar5 = (jsgf_rule_t *)hash_table_enter(h,pcVar4,pjVar5);
            if (pjVar5 != rule_00) {
              err_msg(ERR_WARN,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                      ,0x317,"Multiply defined symbol: %s\n",pcVar4);
            }
            if (!bVar6) {
              hash_table_iter_free((hash_iter_t *)he);
              return rule_00;
            }
          }
        }
      }
    }
  }
  return (jsgf_rule_t *)0x0;
}

Assistant:

jsgf_rule_t *
jsgf_import_rule(jsgf_t * jsgf, char *name)
{
    char *c, *path, *newpath;
    size_t namelen, packlen;
    void *val;
    jsgf_t *imp;
    int import_all;

    /* Trim the leading and trailing <> */
    namelen = strlen(name);
    path = ckd_malloc(namelen - 2 + 6); /* room for a trailing .gram */
    strcpy(path, name + 1);
    /* Split off the first part of the name */
    c = strrchr(path, '.');
    if (c == NULL) {
        E_ERROR("Imported rule is not qualified: %s\n", name);
        ckd_free(path);
        return NULL;
    }
    packlen = c - path;
    *c = '\0';

    /* Look for import foo.* */
    import_all = (strlen(name) > 2
                  && 0 == strcmp(name + namelen - 3, ".*>"));

    /* Construct a filename. */
    for (c = path; *c; ++c)
        if (*c == '.')
            *c = '/';
    strcat(path, ".gram");
    newpath = path_list_search(jsgf->searchpath, path);
    if (newpath == NULL) {
        E_ERROR("Failed to find grammar %s\n", path);
        ckd_free(path);
        return NULL;
    }
    ckd_free(path);

    path = newpath;
    E_INFO("Importing %s from %s to %s\n", name, path, jsgf->name);

    /* FIXME: Also, we need to make sure that path is fully qualified
     * here, by adding any prefixes from jsgf->name to it. */
    /* See if we have parsed it already */
    if (hash_table_lookup(jsgf->imports, path, &val) == 0) {
        E_INFO("Already imported %s\n", path);
        imp = val;
        ckd_free(path);
    }
    else {
        /* If not, parse it. */
        imp = jsgf_parse_file(path, jsgf);
        val = hash_table_enter(jsgf->imports, path, imp);
        if (val != (void *) imp) {
            E_WARN("Multiply imported file: %s\n", path);
        }
    }
    if (imp != NULL) {
        hash_iter_t *itor;
        /* Look for public rules matching rulename. */
        for (itor = hash_table_iter(imp->rules); itor;
             itor = hash_table_iter_next(itor)) {
            hash_entry_t *he = itor->ent;
            jsgf_rule_t *rule = hash_entry_val(he);
            int rule_matches;
            char *rule_name = importname2rulename(name);

            if (import_all) {
                /* Match package name (symbol table is shared) */
                rule_matches =
                    !strncmp(rule_name, rule->name, packlen + 1);
            }
            else {
                /* Exact match */
                rule_matches = !strcmp(rule_name, rule->name);
            }
            ckd_free(rule_name);
            if (rule->is_public && rule_matches) {
                void *val;
                char *newname;

                /* Link this rule into the current namespace. */
                c = strrchr(rule->name, '.');
                assert(c != NULL);
                newname = jsgf_fullname(jsgf, c);

                E_INFO("Imported %s\n", newname);
                val = hash_table_enter(jsgf->rules, newname,
                                       jsgf_rule_retain(rule));
                if (val != (void *) rule) {
                    E_WARN("Multiply defined symbol: %s\n", newname);
                }
                if (!import_all) {
                    hash_table_iter_free(itor);
                    return rule;
                }
            }
        }
    }

    return NULL;
}